

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayDepthCase::createTexture
          (TexSubImageCubeArrayDepthCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  TransferFormat TVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int height;
  deUint32 tex;
  ContextWrapper *local_d0;
  ulong local_c8;
  TransferFormat local_c0;
  Vec4 local_b8;
  Vec4 local_a8;
  TextureLevel levelData;
  PixelBufferAccess local_68;
  Random rnd;
  
  TVar7 = glu::getTransferFormat((this->super_TextureCubeArraySpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  tex = 0;
  local_c8 = (ulong)TVar7 >> 0x20;
  local_c0 = TVar7;
  local_68.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(TVar7.format,TVar7.dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_68);
  this_00 = &(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x9009,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError(this_00);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureSpecificationTests.cpp"
                  ,0x295);
  local_d0 = this_00;
  if (0 < (this->super_TextureCubeArraySpecCase).m_numLevels) {
    iVar8 = 0;
    do {
      iVar10 = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)iVar8 & 0x1f);
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      local_a8.m_data[0] = -1.5;
      local_a8.m_data[1] = -2.0;
      local_a8.m_data[2] = 1.7;
      local_a8.m_data[3] = -1.5;
      local_b8.m_data[0] = 2.0;
      local_b8.m_data[1] = 1.5;
      local_b8.m_data[2] = -1.0;
      local_b8.m_data[3] = 2.0;
      tcu::TextureLevel::setSize
                (&levelData,iVar10,iVar10,(this->super_TextureCubeArraySpecCase).m_depth);
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      tcu::fillWithComponentGradients(&local_68,&local_a8,&local_b8);
      iVar12 = (this->super_TextureCubeArraySpecCase).m_depth;
      iVar13 = *(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4;
      tcu::TextureLevel::getAccess(&local_68,&levelData);
      sglr::ContextWrapper::glTexImage3D
                (local_d0,0x9009,iVar8,iVar13,iVar10,iVar10,iVar12,0,local_c0.format,
                 (deUint32)local_c8,local_68.super_ConstPixelBufferAccess.m_data);
      iVar8 = iVar8 + 1;
      iVar10 = (this->super_TextureCubeArraySpecCase).m_numLevels;
    } while (iVar8 < iVar10);
    if (0 < iVar10) {
      iVar8 = 0;
      do {
        uVar9 = (this->super_TextureCubeArraySpecCase).m_size >> ((byte)iVar8 & 0x1f);
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        dVar1 = deRandom_getUint32(&rnd.m_rnd);
        dVar2 = deRandom_getUint32(&rnd.m_rnd);
        uVar11 = (this->super_TextureCubeArraySpecCase).m_depth;
        dVar3 = deRandom_getUint32(&rnd.m_rnd);
        uVar11 = dVar3 % uVar11;
        dVar3 = deRandom_getUint32(&rnd.m_rnd);
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        iVar10 = (this->super_TextureCubeArraySpecCase).m_depth;
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        local_a8.m_data[0] = 2.0;
        local_a8.m_data[1] = 1.5;
        local_a8.m_data[2] = -1.0;
        local_a8.m_data[3] = 2.0;
        local_b8.m_data[0] = -1.5;
        local_b8.m_data[1] = -2.0;
        local_b8.m_data[2] = 1.7;
        local_b8.m_data[3] = -1.5;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        iVar13 = dVar1 % uVar9 + 1;
        height = dVar2 % uVar9 + 1;
        iVar12 = uVar11 + 1;
        tcu::TextureLevel::setSize(&levelData,iVar13,height,iVar12);
        tcu::TextureLevel::getAccess(&local_68,&levelData);
        tcu::fillWithGrid(&local_68,dVar6 % 0xf + 2,&local_a8,&local_b8);
        tcu::TextureLevel::getAccess(&local_68,&levelData);
        sglr::ContextWrapper::glTexSubImage3D
                  (local_d0,0x9009,iVar8,dVar3 % (uVar9 - dVar1 % uVar9),
                   dVar4 % (uVar9 - dVar2 % uVar9),dVar5 % (iVar10 - uVar11),iVar13,height,iVar12,
                   local_c0.format,(deUint32)local_c8,local_68.super_ConstPixelBufferAccess.m_data);
        iVar8 = iVar8 + 1;
      } while (iVar8 < (this->super_TextureCubeArraySpecCase).m_numLevels);
    }
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_size >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelW, m_depth);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, m_internalFormat, levelW, levelW, m_depth, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_size >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelW);
			const int	d			= rnd.getInt(1, m_depth);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelW-h);
			const int	z			= rnd.getInt(0, m_depth-d);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h, d);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, ndx, x, y, z, w, h, d, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}